

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O3

bool __thiscall FShader::Bind(FShader *this)

{
  FShaderManager *pFVar1;
  
  pFVar1 = GLRenderer->mShaderManager;
  if (pFVar1->mActiveShader != this) {
    (*_ptrc_glUseProgram)(this->hShader);
    pFVar1->mActiveShader = this;
  }
  return true;
}

Assistant:

bool FShader::Bind()
{
	GLRenderer->mShaderManager->SetActiveShader(this);
	return true;
}